

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Geometry2D.cpp
# Opt level: O2

void __thiscall Assimp::X3DImporter::ParseNode_Geometry2D_Disk2D(X3DImporter *this)

{
  FIReader *pFVar1;
  _List_node_base *p_Var2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  undefined4 extraout_var_00;
  undefined7 extraout_var;
  CX3DImporter_NodeElement_Geometry2D *this_00;
  DeadlyImportError *this_01;
  _Self __tmp_1;
  _List_node_base *p_Var6;
  _Self __tmp;
  _List_node_base *p_Var7;
  string *psVar8;
  uint pAttrIdx;
  CX3DImporter_NodeElement *pCVar9;
  size_type sStack_f0;
  allocator<char> local_d9;
  CX3DImporter_NodeElement *ne;
  float local_cc;
  float local_c8;
  undefined4 local_c4;
  list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> tlist_o;
  string an;
  list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> tlist_i;
  string use;
  string def;
  
  def._M_dataplus._M_p = (pointer)&def.field_2;
  def._M_string_length = 0;
  use._M_dataplus._M_p = (pointer)&use.field_2;
  use._M_string_length = 0;
  pAttrIdx = 0;
  ne = (CX3DImporter_NodeElement *)0x0;
  def.field_2._M_local_buf[0] = '\0';
  use.field_2._M_local_buf[0] = '\0';
  uVar4 = (*(((this->mReader)._M_t.
              super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
              super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
              super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
            super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  if ((int)uVar4 < 1) {
    uVar4 = 0;
  }
  local_c8 = 0.0;
  local_cc = 1.0;
  local_c4 = 0;
  do {
    if (uVar4 == pAttrIdx) {
      if (use._M_string_length == 0) {
        tlist_o.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        _M_node._M_size = 0;
        tlist_i.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        _M_node.super__List_node_base._M_next = (_List_node_base *)&tlist_i;
        tlist_i.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        _M_node._M_size = 0;
        tlist_o.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        _M_node.super__List_node_base._M_next = (_List_node_base *)&tlist_o;
        tlist_o.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        _M_node.super__List_node_base._M_prev = (_List_node_base *)&tlist_o;
        tlist_i.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        _M_node.super__List_node_base._M_prev =
             tlist_i.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl._M_node.super__List_node_base._M_next;
        if (local_cc < local_c8) {
          std::__cxx11::string::string<std::allocator<char>>((string *)&an,"innerRadius",&local_d9);
          Throw_IncorrectAttrValue(this,&an);
          std::__cxx11::string::~string((string *)&an);
        }
        this_00 = (CX3DImporter_NodeElement_Geometry2D *)operator_new(0x78);
        CX3DImporter_NodeElement_Geometry2D::CX3DImporter_NodeElement_Geometry2D
                  (this_00,ENET_Disk2D,this->NodeElement_Cur);
        ne = (CX3DImporter_NodeElement *)this_00;
        if (def._M_string_length != 0) {
          std::__cxx11::string::_M_assign((string *)&(this_00->super_CX3DImporter_NodeElement).ID);
        }
        GeometryHelper_Make_Arc2D(this,0.0,0.0,local_cc,10,&tlist_o);
        if ((local_c8 != 0.0) || (NAN(local_c8))) {
          pCVar9 = ne + 1;
          if ((local_c8 != local_cc) || (NAN(local_c8) || NAN(local_cc))) {
            GeometryHelper_Make_Arc2D(this,0.0,0.0,local_c8,10,&tlist_i);
            p_Var6 = tlist_o.
                     super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl._M_node.super__List_node_base._M_next;
            p_Var7 = tlist_i.
                     super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl._M_node.super__List_node_base._M_next;
            if (tlist_i.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                _M_impl._M_node._M_size < 2) {
              this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&an,"Disk2D. Not enough points for creating quad list.",&local_d9
                        );
              DeadlyImportError::DeadlyImportError(this_01,&an);
              __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
            while (p_Var7 != (_List_node_base *)&tlist_i) {
              p_Var2 = (((_List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                        &p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
              std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                        ((list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)pCVar9,
                         (value_type *)(p_Var7 + 1));
              p_Var7 = p_Var6->_M_next;
              std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                        ((list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)pCVar9,
                         (value_type *)(p_Var6 + 1));
              std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                        ((list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)pCVar9,
                         (value_type *)(p_Var7 + 1));
              std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                        ((list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)pCVar9,
                         (value_type *)(p_Var2 + 1));
              p_Var6 = p_Var7;
              p_Var7 = p_Var2;
            }
            std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                      ((list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)pCVar9,
                       (value_type *)
                       &tlist_i.
                        super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl._M_node._M_size);
            std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                      ((list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)pCVar9,
                       (value_type *)
                       &tlist_o.
                        super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl._M_node._M_size);
            std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                      ((list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)pCVar9,
                       (value_type *)
                       (tlist_o.
                        super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl._M_node.super__List_node_base._M_next + 1));
            std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                      ((list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)pCVar9,
                       (value_type *)
                       (tlist_o.
                        super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl._M_node.super__List_node_base._M_next + 1));
            sStack_f0 = 4;
          }
          else {
            GeometryHelper_Extend_PointToLine
                      (this,&tlist_o,
                       (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)pCVar9);
            sStack_f0 = 2;
          }
        }
        else {
          std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator=
                    ((list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)(ne + 1),
                     &tlist_o);
          sStack_f0 = tlist_o.
                      super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl._M_node._M_size;
        }
        ne[1].ID._M_string_length = sStack_f0;
        ne[1].ID.field_2._M_local_buf[0] = (byte)local_c4 & 1;
        iVar5 = (*(((this->mReader)._M_t.
                    super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                    .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                  super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
        pCVar9 = ne;
        if ((char)iVar5 == '\0') {
          std::__cxx11::string::string<std::allocator<char>>((string *)&an,"Disk2D",&local_d9);
          ParseNode_Metadata(this,pCVar9,&an);
          std::__cxx11::string::~string((string *)&an);
        }
        else {
          std::__cxx11::
          list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::push_back
                    (&this->NodeElement_Cur->Child,&ne);
        }
        std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
        ::push_back(&this->NodeElement_List,&ne);
        std::__cxx11::_List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::_M_clear
                  (&tlist_i.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                  );
        std::__cxx11::_List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::_M_clear
                  (&tlist_o.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                  );
      }
      else {
        XML_CheckNode_MustBeEmpty(this);
        if (def._M_string_length != 0) {
          Throw_DEF_And_USE(this);
        }
        bVar3 = FindNodeElement(this,&use,ENET_Disk2D,&ne);
        if (!bVar3) {
          Throw_USE_NotFound(this,&use);
        }
        std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
        ::push_back(&this->NodeElement_Cur->Child,&ne);
      }
      std::__cxx11::string::~string((string *)&use);
      std::__cxx11::string::~string((string *)&def);
      return;
    }
    pFVar1 = (this->mReader)._M_t.
             super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
             super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
             super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
    iVar5 = (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                      (pFVar1,(ulong)pAttrIdx);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&an,(char *)CONCAT44(extraout_var_00,iVar5),(allocator<char> *)&tlist_o);
    bVar3 = std::operator==(&an,"DEF");
    if (bVar3) {
      pFVar1 = (this->mReader)._M_t.
               super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
               super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
               super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
      (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                (pFVar1,(ulong)pAttrIdx);
      psVar8 = &def;
LAB_005a3941:
      std::__cxx11::string::assign((char *)psVar8);
    }
    else {
      bVar3 = std::operator==(&an,"USE");
      if (bVar3) {
        pFVar1 = (this->mReader)._M_t.
                 super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                 super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
        (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                  (pFVar1,(ulong)pAttrIdx);
        psVar8 = &use;
        goto LAB_005a3941;
      }
      bVar3 = std::operator==(&an,"bboxCenter");
      if (((!bVar3) && (bVar3 = std::operator==(&an,"bboxSize"), !bVar3)) &&
         (bVar3 = std::operator==(&an,"containerField"), !bVar3)) {
        bVar3 = std::operator==(&an,"innerRadius");
        if (bVar3) {
          local_c8 = XML_ReadNode_GetAttrVal_AsFloat(this,pAttrIdx);
        }
        else {
          bVar3 = std::operator==(&an,"outerRadius");
          if (bVar3) {
            local_cc = XML_ReadNode_GetAttrVal_AsFloat(this,pAttrIdx);
          }
          else {
            bVar3 = std::operator==(&an,"solid");
            if (bVar3) {
              bVar3 = XML_ReadNode_GetAttrVal_AsBool(this,pAttrIdx);
              local_c4 = (undefined4)CONCAT71(extraout_var,bVar3);
            }
            else {
              Throw_IncorrectAttr(this,&an);
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&an);
    pAttrIdx = pAttrIdx + 1;
  } while( true );
}

Assistant:

void X3DImporter::ParseNode_Geometry2D_Disk2D()
{
    std::string def, use;
    float innerRadius = 0;
    float outerRadius = 1;
    bool solid = false;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_RET("innerRadius", innerRadius, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_RET("outerRadius", outerRadius, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_RET("solid", solid, XML_ReadNode_GetAttrVal_AsBool);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_Disk2D, ne);
	}
	else
	{
		std::list<aiVector3D> tlist_o, tlist_i;

		if(innerRadius > outerRadius) Throw_IncorrectAttrValue("innerRadius");

		// create and if needed - define new geometry object.
		ne = new CX3DImporter_NodeElement_Geometry2D(CX3DImporter_NodeElement::ENET_Disk2D, NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

		// create point list of geometry object.
		///TODO: IME - AI_CONFIG for NumSeg
		GeometryHelper_Make_Arc2D(0, 0, outerRadius, 10, tlist_o);// outer circle
		if(innerRadius == 0.0f)
		{// make filled disk
			// in tlist_o we already have points of circle. just copy it and sign as polygon.
			((CX3DImporter_NodeElement_Geometry2D*)ne)->Vertices = tlist_o;
			((CX3DImporter_NodeElement_Geometry2D*)ne)->NumIndices = tlist_o.size();
		}
		else if(innerRadius == outerRadius)
		{// make circle
			// in tlist_o we already have points of circle. convert it to line set.
			GeometryHelper_Extend_PointToLine(tlist_o, ((CX3DImporter_NodeElement_Geometry2D*)ne)->Vertices);
			((CX3DImporter_NodeElement_Geometry2D*)ne)->NumIndices = 2;
		}
		else
		{// make disk
			std::list<aiVector3D>& vlist = ((CX3DImporter_NodeElement_Geometry2D*)ne)->Vertices;// just short alias.

			GeometryHelper_Make_Arc2D(0, 0, innerRadius, 10, tlist_i);// inner circle
			//
			// create quad list from two point lists
			//
			if(tlist_i.size() < 2) throw DeadlyImportError("Disk2D. Not enough points for creating quad list.");// tlist_i and tlist_o has equal size.

			// add all quads except last
			for(std::list<aiVector3D>::iterator it_i = tlist_i.begin(), it_o = tlist_o.begin(); it_i != tlist_i.end();)
			{
				// do not forget - CCW direction
				vlist.push_back(*it_i++);// 1st point
				vlist.push_back(*it_o++);// 2nd point
				vlist.push_back(*it_o);// 3rd point
				vlist.push_back(*it_i);// 4th point
			}

			// add last quad
			vlist.push_back(*tlist_i.end());// 1st point
			vlist.push_back(*tlist_o.end());// 2nd point
			vlist.push_back(*tlist_o.begin());// 3rd point
			vlist.push_back(*tlist_o.begin());// 4th point

			((CX3DImporter_NodeElement_Geometry2D*)ne)->NumIndices = 4;
		}

		((CX3DImporter_NodeElement_Geometry2D*)ne)->Solid = solid;
		// check for X3DMetadataObject childs.
		if(!mReader->isEmptyElement())
			ParseNode_Metadata(ne, "Disk2D");
		else
			NodeElement_Cur->Child.push_back(ne);// add made object as child to current element

		NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
	}// if(!use.empty()) else
}